

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppression::set_allocated_int64classlabels
          (NonMaximumSuppression *this,Int64Vector *int64classlabels)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Int64Vector *int64classlabels_local;
  NonMaximumSuppression *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_ClassLabels(this);
  if (int64classlabels != (Int64Vector *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&int64classlabels->super_MessageLite);
    message_arena = (Arena *)int64classlabels;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<CoreML::Specification::Int64Vector>
                              (message_arena_00,int64classlabels,submessage_arena_00);
    }
    set_has_int64classlabels(this);
    (this->ClassLabels_).stringclasslabels_ = (StringVector *)message_arena;
  }
  return;
}

Assistant:

void NonMaximumSuppression::set_allocated_int64classlabels(::CoreML::Specification::Int64Vector* int64classlabels) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_ClassLabels();
  if (int64classlabels) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(int64classlabels));
    if (message_arena != submessage_arena) {
      int64classlabels = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, int64classlabels, submessage_arena);
    }
    set_has_int64classlabels();
    ClassLabels_.int64classlabels_ = int64classlabels;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.NonMaximumSuppression.int64ClassLabels)
}